

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O2

void __thiscall LSM_tree::reset(LSM_tree *this)

{
  pointer ppLVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  int i;
  ulong uVar5;
  path local_40;
  
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_40,(char (*) [5])0x109262,auto_format);
  bVar2 = std::filesystem::exists(&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  if (bVar2) {
    for (uVar5 = 0;
        ppLVar1 = (this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3);
        uVar5 = uVar5 + 1) {
      Level::clear(ppLVar1[uVar5]);
    }
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_40,(char (*) [5])0x109262,auto_format);
    lVar3 = std::filesystem::remove_all(&local_40);
    std::filesystem::__cxx11::path::~path(&local_40);
    if (lVar3 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"fail to remove DATA");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  else {
    ppLVar1 = (this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppLVar1) {
      (this->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppLVar1;
    }
  }
  return;
}

Assistant:

void LSM_tree::reset() {


    if(!fs::exists("DATA"))
    {
        disk.clear();
        return;
    }

    for (int i = 0; i < disk.size(); i++) {

        //int size=disk[i]->size();
        Level* level=disk[i];
        level->clear();


    }
    if(!std::filesystem::remove_all("DATA"))
    {
        cout<<"fail to remove DATA"<<endl;
    }

}